

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O3

void __thiscall GetUniquePathTest_Slurm_Test::TestBody(GetUniquePathTest_Slurm_Test *this)

{
  size_type *psVar1;
  size_type *psVar2;
  char *pcVar3;
  undefined1 local_1b8 [8];
  WithEnv withJobID;
  WithEnv withTestVar;
  string pathWithPID;
  char *expectedSlurmParent;
  WithEnv withRank;
  string expectedSlurmChild;
  WithEnv withForced;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  psVar1 = &withTestVar.var._M_string_length;
  withJobID.val.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withJobID.val.field_2 + 8),"SLURM_JOB_ID","");
  psVar2 = &withRank.var._M_string_length;
  expectedSlurmParent = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&expectedSlurmParent,"1","");
  WithEnv::WithEnv((WithEnv *)local_1b8,(string *)((long)&withJobID.val.field_2 + 8),
                   (string *)&expectedSlurmParent);
  if ((size_type *)expectedSlurmParent != psVar2) {
    operator_delete(expectedSlurmParent,withRank.var._M_string_length + 1);
  }
  if ((size_type *)withJobID.val.field_2._8_8_ != psVar1) {
    operator_delete((void *)withJobID.val.field_2._8_8_,withTestVar.var._M_string_length + 1);
  }
  expectedSlurmParent = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&expectedSlurmParent,"GPROF_TEST_PATH","");
  psVar1 = &withForced.var._M_string_length;
  expectedSlurmChild.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedSlurmChild.field_2 + 8),"/var/log/some_file_name","");
  WithEnv::WithEnv((WithEnv *)((long)&withJobID.val.field_2 + 8),(string *)&expectedSlurmParent,
                   (string *)((long)&expectedSlurmChild.field_2 + 8));
  if ((size_type *)expectedSlurmChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedSlurmChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if ((size_type *)expectedSlurmParent != psVar2) {
    operator_delete(expectedSlurmParent,withRank.var._M_string_length + 1);
  }
  expectedSlurmParent = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&expectedSlurmParent,"/var/log/some_file_name","");
  AppendPID((string *)((long)&withTestVar.val.field_2 + 8),(string *)&expectedSlurmParent);
  if ((size_type *)expectedSlurmParent != psVar2) {
    operator_delete(expectedSlurmParent,withRank.var._M_string_length + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(expectedSlurmChild.field_2._M_local_buf + 8),"pathWithPID","GetTestPath()"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &expectedSlurmParent);
  if ((size_type *)expectedSlurmParent != psVar2) {
    operator_delete(expectedSlurmParent,withRank.var._M_string_length + 1);
  }
  if (expectedSlurmChild.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&expectedSlurmParent);
    if (withForced.var._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)withForced.var._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),(Message *)&expectedSlurmParent);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8));
    if (expectedSlurmParent != (char *)0x0) {
      (**(code **)(*(long *)expectedSlurmParent + 8))();
    }
  }
  if (withForced.var._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&withForced,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 withForced.var._M_dataplus._M_p);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(expectedSlurmChild.field_2._M_local_buf + 8),"pathWithPID","GetTestPath()"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &expectedSlurmParent);
  if ((size_type *)expectedSlurmParent != psVar2) {
    operator_delete(expectedSlurmParent,withRank.var._M_string_length + 1);
  }
  if (expectedSlurmChild.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&expectedSlurmParent);
    if (withForced.var._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)withForced.var._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x8c,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),(Message *)&expectedSlurmParent);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8));
    if (expectedSlurmParent != (char *)0x0) {
      (**(code **)(*(long *)expectedSlurmParent + 8))();
    }
  }
  if (withForced.var._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&withForced,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 withForced.var._M_dataplus._M_p);
  }
  setenv((char *)withJobID.val.field_2._8_8_,(char *)withTestVar.var.field_2._8_8_,1);
  expectedSlurmChild.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedSlurmChild.field_2 + 8),"SLURM_PROCID","");
  psVar2 = &expectedSlurmChild._M_string_length;
  withRank.val.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withRank.val.field_2 + 8),"5","");
  WithEnv::WithEnv((WithEnv *)&expectedSlurmParent,(string *)((long)&expectedSlurmChild.field_2 + 8)
                   ,(string *)((long)&withRank.val.field_2 + 8));
  if ((size_type *)withRank.val.field_2._8_8_ != psVar2) {
    operator_delete((void *)withRank.val.field_2._8_8_,expectedSlurmChild._M_string_length + 1);
  }
  if ((size_type *)expectedSlurmChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedSlurmChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  pathWithPID.field_2._8_8_ = anon_var_dwarf_533d;
  expectedSlurmChild.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedSlurmChild.field_2 + 8),"/var/log/some_file_name.slurmid-5",
             "");
  AppendPID((string *)((long)&withRank.val.field_2 + 8),
            (string *)((long)&expectedSlurmChild.field_2 + 8));
  if ((size_type *)expectedSlurmChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedSlurmChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)local_48,"expectedSlurmParent","GetTestPath()",
             (char **)((long)&pathWithPID.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedSlurmChild.field_2 + 8));
  if ((size_type *)expectedSlurmChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedSlurmChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedSlurmChild.field_2 + 8));
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedSlurmChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedSlurmChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedSlurmChild.field_2._8_8_ + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_48,"expectedSlurmChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withRank.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedSlurmChild.field_2 + 8));
  if ((size_type *)expectedSlurmChild.field_2._8_8_ != psVar1) {
    operator_delete((void *)expectedSlurmChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedSlurmChild.field_2 + 8));
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedSlurmChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedSlurmChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedSlurmChild.field_2._8_8_ + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  setenv((char *)withJobID.val.field_2._8_8_,(char *)withTestVar.var.field_2._8_8_,1);
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"GPROF_TEST_PATH_USE_PID","");
  withForced.val.field_2._8_8_ = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withForced.val.field_2 + 8),"1","");
  WithEnv::WithEnv((WithEnv *)((long)&expectedSlurmChild.field_2 + 8),(string *)local_48,
                   (string *)((long)&withForced.val.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)withForced.val.field_2._8_8_ != &local_60) {
    operator_delete((void *)withForced.val.field_2._8_8_,local_60._M_allocated_capacity + 1);
  }
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedSlurmChild",
             "GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withRank.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedSlurmChild",
             "GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withRank.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&expectedSlurmChild.field_2 + 8));
  if ((size_type *)withRank.val.field_2._8_8_ != psVar2) {
    operator_delete((void *)withRank.val.field_2._8_8_,expectedSlurmChild._M_string_length + 1);
  }
  WithEnv::~WithEnv((WithEnv *)&expectedSlurmParent);
  if ((size_type *)withTestVar.val.field_2._8_8_ != &pathWithPID._M_string_length) {
    operator_delete((void *)withTestVar.val.field_2._8_8_,pathWithPID._M_string_length + 1);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&withJobID.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_1b8);
  return;
}

Assistant:

TEST(GetUniquePathTest, Slurm) {
  WithEnv withJobID("SLURM_JOB_ID", "1");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  auto pathWithPID = AppendPID(TEST_VAL);

  // Test non-forced case (no process ID found)
  EXPECT_EQ(pathWithPID, GetTestPath());

  // Now that we ran GetUniquePathFromEnv once, we can test "child"
  // case, which appends pid
  EXPECT_EQ(pathWithPID, GetTestPath());

  withTestVar.Reset();
  WithEnv withRank("SLURM_PROCID", "5");

  const auto expectedSlurmParent = TEST_VAL ".slurmid-5";
  const auto expectedSlurmChild = AppendPID(expectedSlurmParent);

  // Test parent case - must include "proc id" (will set the child flag)
  EXPECT_EQ(expectedSlurmParent, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedSlurmChild, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Now that pid is forced we expect both pid and proc-id appended.
  EXPECT_EQ(expectedSlurmChild, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedSlurmChild, GetTestPath());
}